

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

mraa_gpio_context mraa_gpio_init_multi(int *pins,int num_pins)

{
  mraa_gpio_context p_Var1;
  mraa_gpio_context p_Var2;
  mraa_gpio_context p_Var3;
  ulong uVar4;
  mraa_gpio_context unaff_R12;
  
  if (plat == (mraa_board_t *)0x0) {
    syslog(3,"[GPIOD_INTERFACE]: init: platform not initialised");
  }
  else {
    if (plat->chardev_capable != 0) {
      p_Var1 = mraa_gpio_chardev_init(pins,num_pins);
      return p_Var1;
    }
    if (0 < num_pins) {
      uVar4 = 0;
      p_Var1 = (mraa_gpio_context)0x0;
      do {
        p_Var2 = mraa_gpio_init(pins[uVar4]);
        if (p_Var2 == (mraa_gpio_context)0x0) {
          syslog(3,"mraa_gpio_init_multi() error initializing pin %i",(ulong)(uint)pins[uVar4]);
        }
        else {
          p_Var3 = p_Var2;
          if (p_Var1 != (mraa_gpio_context)0x0) {
            unaff_R12->next = p_Var2;
            p_Var3 = p_Var1;
          }
          p_Var2->next = (_gpio *)0x0;
          unaff_R12 = p_Var2;
          p_Var1 = p_Var3;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)num_pins != uVar4);
      if (p_Var1 != (mraa_gpio_context)0x0) {
        p_Var1->num_pins = num_pins;
        return p_Var1;
      }
    }
  }
  return (mraa_gpio_context)0x0;
}

Assistant:

mraa_gpio_context
mraa_gpio_init_multi(int pins[], int num_pins)
{
    mraa_board_t* board = plat;

    if (board == NULL) {
        syslog(LOG_ERR, "[GPIOD_INTERFACE]: init: platform not initialised");
        return NULL;
    }

    if (board->chardev_capable)
        return mraa_gpio_chardev_init(pins, num_pins);

    /* Fallback to legacy interface. */
    mraa_gpio_context head = NULL, current, tmp;

    for (int i = 0; i < num_pins; ++i) {
        tmp = mraa_gpio_init(pins[i]);
        if (!tmp) {
            syslog(LOG_ERR, "mraa_gpio_init_multi() error initializing pin %i", pins[i]);
            continue;
        }

        if (head == NULL) {
            head = tmp;
            current = tmp;
        } else {
            current->next = tmp;
            current = tmp;
        }

        current->next = NULL;
    }

    if (head != NULL) {
        head->num_pins = num_pins;
    }

    return head;
}